

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

ModelPtr __thiscall libcellml::Importer::flattenModel(Importer *this,ModelPtr *model)

{
  IssueImpl *pIVar1;
  bool bVar2;
  ImporterImpl *pIVar3;
  element_type *peVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  element_type *peVar7;
  int in_ECX;
  __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  void *__child_stack;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  ComponentPtr *in_R8;
  ModelPtr MVar9;
  shared_ptr<libcellml::ComponentEntity> local_108;
  undefined1 local_f8 [8];
  ComponentPtr c;
  size_t index_1;
  undefined1 local_d0 [8];
  UnitsPtr u;
  size_t index;
  string local_a0;
  undefined1 local_80 [8];
  IssuePtr issue_1;
  string local_68;
  undefined1 local_38 [8];
  IssuePtr issue;
  ModelPtr *model_local;
  Importer *this_local;
  ModelPtr *flatModel;
  
  pIVar3 = pFunc((Importer *)model);
  Logger::LoggerImpl::removeAllIssues(&pIVar3->super_LoggerImpl);
  issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0
  ;
  std::shared_ptr<libcellml::Model>::shared_ptr((shared_ptr<libcellml::Model> *)this);
  bVar2 = std::operator==((shared_ptr<libcellml::Model> *)in_RDX,(nullptr_t)0x0);
  if (bVar2) {
    Issue::IssueImpl::create();
    peVar5 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_38);
    Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,INVALID_ARGUMENT);
    peVar5 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_38);
    pIVar1 = peVar5->mPimpl;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"The model is null.",
               (allocator<char> *)
               ((long)&issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    Issue::IssueImpl::setDescription(pIVar1,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    pIVar3 = pFunc((Importer *)model);
    Logger::LoggerImpl::addIssue(&pIVar3->super_LoggerImpl,(IssuePtr *)local_38);
    issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
         1;
    issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
         = 1;
    std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_38);
    _Var8._M_pi = extraout_RDX;
  }
  else {
    pIVar3 = pFunc((Importer *)model);
    bVar2 = ImporterImpl::hasImportIssues(pIVar3,(ModelPtr *)in_RDX);
    if (bVar2) {
      issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
           = 1;
      issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = 1;
      _Var8._M_pi = extraout_RDX_00;
    }
    else {
      peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(in_RDX);
      bVar2 = Model::isDefined(peVar4);
      if (bVar2) {
        peVar4 = std::
                 __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(in_RDX);
        Model::clone((Model *)&index,(__fn *)peVar4,__child_stack,in_ECX,in_R8);
        std::shared_ptr<libcellml::Model>::operator=
                  ((shared_ptr<libcellml::Model> *)this,(shared_ptr<libcellml::Model> *)&index);
        std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)&index);
        while( true ) {
          peVar4 = std::
                   __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
          bVar2 = Model::hasImports(peVar4);
          if (!bVar2) break;
          u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          while( true ) {
            _Var8._M_pi = u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            peVar4 = std::
                     __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Model::unitsCount(peVar4);
            if (p_Var6 <= _Var8._M_pi) break;
            peVar4 = std::
                     __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            Model::units((Model *)local_d0,(size_t)peVar4);
            peVar7 = std::
                     __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_d0);
            bVar2 = ImportedEntity::isImport(&peVar7->super_ImportedEntity);
            _Var8 = u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            if (bVar2) {
              std::shared_ptr<libcellml::Component>::shared_ptr
                        ((shared_ptr<libcellml::Component> *)&index_1,(nullptr_t)0x0);
              flattenUnitsImports((libcellml *)this,(ModelPtr *)local_d0,(UnitsPtr *)_Var8._M_pi,
                                  (size_t)&index_1,in_R8);
              std::shared_ptr<libcellml::Component>::~shared_ptr
                        ((shared_ptr<libcellml::Component> *)&index_1);
            }
            std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_d0)
            ;
            u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
          }
          c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          while( true ) {
            _Var8._M_pi = c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            peVar4 = std::
                     __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ComponentEntity::componentCount(&peVar4->super_ComponentEntity);
            if (p_Var6 <= _Var8._M_pi) break;
            peVar4 = std::
                     __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            ComponentEntity::component((ComponentEntity *)local_f8,(size_t)peVar4);
            std::shared_ptr<libcellml::ComponentEntity>::shared_ptr<libcellml::Model,void>
                      (&local_108,(shared_ptr<libcellml::Model> *)this);
            flattenComponentImports
                      (&local_108,(ComponentPtr *)local_f8,
                       (size_t)c.
                               super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
            std::shared_ptr<libcellml::ComponentEntity>::~shared_ptr(&local_108);
            std::shared_ptr<libcellml::Component>::~shared_ptr
                      ((shared_ptr<libcellml::Component> *)local_f8);
            c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
          }
        }
        peVar4 = std::
                 __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        Model::linkUnits(peVar4);
        issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _7_1_ = 1;
        issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 1;
        _Var8._M_pi = extraout_RDX_02;
      }
      else {
        Issue::IssueImpl::create();
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_80);
        Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,IMPORTER_UNDEFINED_MODEL);
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_80);
        pIVar1 = peVar5->mPimpl;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"The model is not fully defined.",
                   (allocator<char> *)&stack0xffffffffffffff5f);
        Issue::IssueImpl::setDescription(pIVar1,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
        pIVar3 = pFunc((Importer *)model);
        Logger::LoggerImpl::addIssue(&pIVar3->super_LoggerImpl,(IssuePtr *)local_80);
        issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _7_1_ = 1;
        issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 1;
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_80);
        _Var8._M_pi = extraout_RDX_01;
      }
    }
  }
  if ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _7_1_ & 1) == 0) {
    std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)this);
    _Var8._M_pi = extraout_RDX_03;
  }
  MVar9.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  MVar9.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModelPtr)MVar9.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModelPtr Importer::flattenModel(const ModelPtr &model)
{
    pFunc()->removeAllIssues();
    ModelPtr flatModel;
    if (model == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::INVALID_ARGUMENT);
        issue->mPimpl->setDescription("The model is null.");
        pFunc()->addIssue(issue);

        return flatModel;
    }

    if (pFunc()->hasImportIssues(model)) {
        return flatModel;
    }

    if (!model->isDefined()) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_UNDEFINED_MODEL);
        issue->mPimpl->setDescription("The model is not fully defined.");
        pFunc()->addIssue(issue);

        return flatModel;
    }

    flatModel = model->clone();

    while (flatModel->hasImports()) {
        // Go through Units and instantiate any imported Units.
        for (size_t index = 0; index < flatModel->unitsCount(); ++index) {
            auto u = flatModel->units(index);
            if (u->isImport()) {
                flattenUnitsImports(flatModel, u, index, nullptr);
            }
        }

        // Go through Components and instantiate any imported Components.
        for (size_t index = 0; index < flatModel->componentCount(); ++index) {
            auto c = flatModel->component(index);
            flattenComponentImports(flatModel, c, index);
        }
    }

    flatModel->linkUnits();

    return flatModel;
}